

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::ViewportArray::ScissorAPI::iterate(ScissorAPI *this)

{
  int *piVar1;
  int *piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  ulong uVar8;
  char *description;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool test_result;
  GLint max_viewports;
  vector<int,_std::allocator<int>_> scissor_box_data_b;
  vector<int,_std::allocator<int>_> scissor_box_data_a;
  bool local_6d;
  int local_6c;
  undefined1 local_68 [16];
  pointer local_58;
  undefined1 local_48 [16];
  pointer local_38;
  long lVar7;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar5);
    local_6d = true;
    local_6c = 0;
    (**(code **)(lVar7 + 0x868))(0x825b,&local_6c);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x797);
    local_38 = (pointer)0x0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    local_68 = (undefined1  [16])0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_48,(ulong)(uint)(local_6c << 2));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_68,(ulong)(uint)(local_6c << 2));
    getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_48);
    if (0 < local_6c) {
      uVar11 = 0;
      lVar12 = 0;
      do {
        piVar1 = (int *)(local_48._0_8_ + (ulong)uVar11 * 4);
        iVar5 = piVar1[1];
        iVar9 = piVar1[2];
        iVar4 = piVar1[3];
        piVar2 = (int *)(local_48._0_8_ + (ulong)uVar11 * 4);
        *piVar2 = *piVar1 + 1;
        piVar2[1] = iVar5 + 1;
        piVar2[2] = iVar9 + -1;
        piVar2[3] = iVar4 + -1;
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 + 4;
      } while (lVar12 < local_6c);
    }
    (**(code **)(lVar7 + 0x1298))(0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"scissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x7b0);
    getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_68);
    compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)local_48,
                        (vector<int,_std::allocator<int>_> *)local_68,"scissorArrayv",&local_6d);
    if (0 < local_6c) {
      uVar11 = 0;
      uVar10 = 0;
      do {
        piVar3 = (pointer)(local_68._0_8_ + (ulong)uVar11 * 4);
        piVar3[0] = 4;
        piVar3[1] = 4;
        piVar3[2] = 8;
        piVar3[3] = 8;
        (**(code **)(lVar7 + 0x12a0))(uVar10 & 0xffffffff,4,4,8,8);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"scissorIndexed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x7c2);
        getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_48);
        compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)local_48,
                            (vector<int,_std::allocator<int>_> *)local_68,"scissorIndexed",&local_6d
                           );
        uVar10 = uVar10 + 1;
        uVar11 = uVar11 + 4;
      } while ((long)uVar10 < (long)local_6c);
      if (0 < local_6c) {
        uVar11 = 0;
        uVar10 = 0;
        do {
          piVar3 = (pointer)(local_48._0_8_ + (ulong)uVar11 * 4);
          piVar3[0] = 8;
          piVar3[1] = 8;
          piVar3[2] = 0xc;
          piVar3[3] = 0xc;
          (**(code **)(lVar7 + 0x12a8))(uVar10 & 0xffffffff);
          dVar6 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar6,"scissorIndexedv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0x7d5);
          getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_68);
          compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)local_48,
                              (vector<int,_std::allocator<int>_> *)local_68,"scissorIndexedv",
                              &local_6d);
          uVar10 = uVar10 + 1;
          uVar11 = uVar11 + 4;
        } while ((long)uVar10 < (long)local_6c);
      }
    }
    uVar10 = 7;
    uVar13 = 0;
    uVar14 = 0;
    while ((long)uVar14 < (long)local_6c) {
      iVar5 = ((uint)uVar14 & 1) * 3 + 1;
      if (uVar14 != 0) {
        uVar8 = 0;
        do {
          piVar1 = (int *)(local_68._0_8_ + (uVar8 & 0xffffffff) * 4);
          *piVar1 = iVar5;
          piVar1[1] = iVar5;
          piVar1[2] = iVar5;
          piVar1[3] = iVar5;
          uVar8 = uVar8 + 4;
        } while (uVar13 != uVar8);
      }
      uVar14 = uVar14 + 1;
      iVar9 = (int)uVar10;
      uVar11 = (uint)uVar14;
      uVar8 = uVar14 & 0xffffffff;
      while ((int)uVar11 < local_6c) {
        iVar4 = (int)uVar10;
        *(int *)(local_68._0_8_ + (ulong)(iVar4 - 3) * 4) = iVar5;
        *(int *)(local_68._0_8_ + (ulong)(iVar4 - 2) * 4) = iVar5;
        *(int *)(local_68._0_8_ + (ulong)(iVar4 - 1) * 4) = iVar5;
        *(int *)(local_68._0_8_ + uVar10 * 4) = iVar5;
        uVar11 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar11;
        uVar10 = (ulong)(iVar4 + 4);
      }
      (**(code **)(lVar7 + 0x1298))(0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"scissorArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7f5);
      getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_48);
      uVar13 = uVar13 + 4;
      uVar10 = (ulong)(iVar9 + 4);
      compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)local_48,
                          (vector<int,_std::allocator<int>_> *)local_68,"scissorArrayv",&local_6d);
    }
    if (0 < local_6c) {
      uVar11 = 0;
      lVar12 = 0;
      do {
        piVar3 = (pointer)(local_48._0_8_ + (ulong)uVar11 * 4);
        piVar3[0] = 0;
        piVar3[1] = 0;
        *(undefined1 **)(piVar3 + 2) = &DAT_100000001;
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 + 4;
      } while (lVar12 < local_6c);
    }
    (**(code **)(lVar7 + 0x1290))(0,0,1,1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"scissor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x808);
    getScissorBoxes(this,local_6c,(vector<int,_std::allocator<int>_> *)local_68);
    compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)local_48,
                        (vector<int,_std::allocator<int>_> *)local_68,"scissor",&local_6d);
    description = "Fail";
    if (local_6d != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,local_6d ^ QP_TEST_RESULT_FAIL,
               description);
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
    }
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x78b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ScissorAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLint> scissor_box_data_a;
	std::vector<GLint> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of SCISSOR_BOX for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ScissorArrayv;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	getScissorBoxes(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 1;
		scissor_box_data_a[i * m_n_elements + 1] += 1;
		scissor_box_data_a[i * m_n_elements + 2] -= 1;
		scissor_box_data_a[i * m_n_elements + 3] -= 1;
	}

	gl.scissorArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexed,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 4;
		scissor_box_data_b[i * m_n_elements + 1] = 4;
		scissor_box_data_b[i * m_n_elements + 2] = 8;
		scissor_box_data_b[i * m_n_elements + 3] = 8;

		gl.scissorIndexed(i, 4, 4, 8, 8);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexed");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexedv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 8;
		scissor_box_data_a[i * m_n_elements + 1] = 8;
		scissor_box_data_a[i * m_n_elements + 2] = 12;
		scissor_box_data_a[i * m_n_elements + 3] = 12;

		gl.scissorIndexedv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexedv");

		getScissorBoxes(max_viewports, scissor_box_data_b);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexedv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ScissorArrayv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLint value = (0 == i % 2) ? 1 : 4;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.scissorArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Scissor;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0;
		scissor_box_data_a[i * m_n_elements + 1] = 0;
		scissor_box_data_a[i * m_n_elements + 2] = 1;
		scissor_box_data_a[i * m_n_elements + 3] = 1;
	}

	gl.scissor(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissor");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissor", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}